

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool bssl::dtls1_add_change_cipher_spec(SSL *ssl)

{
  SSL *ssl_00;
  uint16_t uVar1;
  Array<unsigned_char> local_28;
  SSL *local_18;
  SSL *ssl_local;
  
  local_18 = ssl;
  uVar1 = ssl_protocol_version(ssl);
  ssl_00 = local_18;
  if (uVar1 < 0x304) {
    Array<unsigned_char>::Array(&local_28);
    ssl_local._7_1_ = add_outgoing(ssl_00,true,&local_28);
    Array<unsigned_char>::~Array(&local_28);
  }
  else {
    ssl_local._7_1_ = 1;
  }
  return (bool)(ssl_local._7_1_ & 1);
}

Assistant:

bool dtls1_add_change_cipher_spec(SSL *ssl) {
  // DTLS 1.3 disables compatibility mode, which means that DTLS 1.3 never sends
  // a ChangeCipherSpec message.
  if (ssl_protocol_version(ssl) > TLS1_2_VERSION) {
    return true;
  }
  return add_outgoing(ssl, true /* ChangeCipherSpec */, Array<uint8_t>());
}